

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::line
          (Fl_PostScript_Graphics_Driver *this,int x0,int y0,int x1,int y1,int x2,int y2)

{
  int x2_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  fprintf((FILE *)this->output,"GS\n");
  fprintf((FILE *)this->output,"BP\n");
  fprintf((FILE *)this->output,"%i %i MT\n",(ulong)(uint)x0,(ulong)(uint)y0);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x1,(ulong)(uint)y1);
  fprintf((FILE *)this->output,"%i %i LT\n",(ulong)(uint)x2,(ulong)(uint)y2);
  fprintf((FILE *)this->output,"ELP\n");
  fprintf((FILE *)this->output,"GR\n");
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::line(int x0, int y0, int x1, int y1, int x2, int y2) {
  fprintf(output, "GS\n");
  fprintf(output,"BP\n");
  fprintf(output, "%i %i MT\n", x0 , y0);
  fprintf(output, "%i %i LT\n", x1 , y1);
  fprintf(output, "%i %i LT\n", x2 , y2);
  fprintf(output, "ELP\n");
  fprintf(output, "GR\n");
}